

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::String::_opNumber
          (String *this,ModifyOp op,uint64_t i,uint32_t base,size_t width,StringFormatFlags flags)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  char *__dest;
  byte bVar7;
  uint64_t uVar8;
  Error EVar9;
  uint uVar10;
  size_t __n;
  byte *pbVar11;
  size_t __n_00;
  ulong uVar12;
  byte *__src;
  bool bVar13;
  char buf [128];
  byte local_3a [10];
  
  uVar10 = 10;
  if (base != 0) {
    uVar10 = base;
  }
  if ((long)i < 0 && (int)flags < 0) {
    bVar7 = 0x2d;
    bVar13 = false;
    uVar8 = -i;
  }
  else {
    uVar8 = i;
    if ((flags & kShowSign) == kNone) {
      bVar13 = (flags & kShowSpace) == kNone;
      bVar7 = (char)(flags & kShowSpace) << 4;
    }
    else {
      bVar7 = 0x2b;
      bVar13 = false;
    }
  }
  uVar4 = uVar10 - 2 >> 1 | (uint)((uVar10 - 2 & 1) != 0) << 0x1f;
  EVar9 = 2;
  if (7 < uVar4) {
    return 2;
  }
  pbVar1 = local_3a + 2;
  pbVar11 = pbVar1;
  switch(uVar4) {
  case 0:
  case 3:
  case 7:
    iVar3 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
      }
    }
    do {
      uVar12 = uVar8 >> ((byte)iVar3 & 0x3f);
      pbVar11[-1] = "0123456789ABCDEF"[(uint)uVar8 & uVar10 - 1];
      pbVar11 = pbVar11 + -1;
      uVar8 = uVar12;
    } while (uVar12 != 0);
    break;
  default:
    goto switchD_001289b1_caseD_1;
  case 4:
    do {
      pbVar11[-1] = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
      pbVar11 = pbVar11 + -1;
      bVar2 = 9 < uVar8;
      uVar8 = uVar8 / 10;
    } while (bVar2);
  }
  __src = pbVar11;
  if ((flags & kAlternate) != kNone) {
    lVar5 = -1;
    if (i == 0 || uVar10 != 8) {
      if (uVar10 != 0x10) goto LAB_00128a71;
      pbVar11[-1] = 0x78;
      lVar5 = -2;
    }
    __src = pbVar11 + lVar5;
    pbVar11[lVar5] = 0x30;
  }
LAB_00128a71:
  uVar12 = (long)pbVar1 - (long)pbVar11;
  if (!bVar13) {
    __src[-1] = bVar7;
    __src = __src + -1;
  }
  uVar6 = 0x100;
  if (width < 0x100) {
    uVar6 = width;
  }
  EVar9 = 0;
  __n = 0;
  if (uVar12 <= uVar6) {
    __n = uVar6 - uVar12;
  }
  __n_00 = (long)pbVar11 - (long)__src;
  __dest = prepare(this,op,uVar12 + __n_00 + __n);
  if (__dest == (char *)0x0) {
    EVar9 = 1;
  }
  else {
    memcpy(__dest,__src,__n_00);
    memset(__dest + __n_00,0x30,__n);
    memcpy(__dest + __n_00 + __n,__src + __n_00,uVar12);
  }
switchD_001289b1_caseD_1:
  return EVar9;
}

Assistant:

Error String::_opNumber(ModifyOp op, uint64_t i, uint32_t base, size_t width, StringFormatFlags flags) noexcept {
  if (base == 0)
    base = 10;

  char buf[128];
  char* p = buf + ASMJIT_ARRAY_SIZE(buf);

  uint64_t orig = i;
  char sign = '\0';

  // Format Sign
  // -----------

  if (Support::test(flags, StringFormatFlags::kSigned) && int64_t(i) < 0) {
    i = uint64_t(-int64_t(i));
    sign = '-';
  }
  else if (Support::test(flags, StringFormatFlags::kShowSign)) {
    sign = '+';
  }
  else if (Support::test(flags, StringFormatFlags::kShowSpace)) {
    sign = ' ';
  }

  // Format Number
  // -------------

  switch (base) {
    case 2:
    case 8:
    case 16: {
      uint32_t shift = Support::ctz(base);
      uint32_t mask = base - 1;

      do {
        uint64_t d = i >> shift;
        size_t r = size_t(i & mask);

        *--p = String_baseN[r];
        i = d;
      } while (i);

      break;
    }

    case 10: {
      do {
        uint64_t d = i / 10;
        uint64_t r = i % 10;

        *--p = char(uint32_t('0') + uint32_t(r));
        i = d;
      } while (i);

      break;
    }

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }

  size_t numberSize = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p);

  // Alternate Form
  // --------------

  if (Support::test(flags, StringFormatFlags::kAlternate)) {
    if (base == 8) {
      if (orig != 0)
        *--p = '0';
    }
    if (base == 16) {
      *--p = 'x';
      *--p = '0';
    }
  }

  // String Width
  // ------------

  if (sign != 0)
    *--p = sign;

  if (width > 256)
    width = 256;

  if (width <= numberSize)
    width = 0;
  else
    width -= numberSize;

  // Finalize
  // --------

  size_t prefixSize = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p) - numberSize;
  char* data = prepare(op, prefixSize + width + numberSize);

  if (!data)
    return DebugUtils::errored(kErrorOutOfMemory);

  memcpy(data, p, prefixSize);
  data += prefixSize;

  memset(data, '0', width);
  data += width;

  memcpy(data, p + prefixSize, numberSize);
  return kErrorOk;
}